

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  char *pcVar9;
  buffer_appender<char> bVar10;
  uint uVar11;
  ulong uVar12;
  buffer<char> *buf;
  uint uVar13;
  uint uVar14;
  _Alloc_hider _Var15;
  _Alloc_hider _Var16;
  ulong uVar17;
  int iVar18;
  size_type sVar19;
  uint uVar20;
  char *pcVar21;
  uint uVar22;
  ulong size;
  int iVar23;
  string groups;
  char digits [40];
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar7 != '\0') {
      uVar11 = this->abs_value;
      uVar14 = 0x1f;
      if ((uVar11 | 1) != 0) {
        for (; (uVar11 | 1) >> uVar14 == 0; uVar14 = uVar14 - 1) {
        }
      }
      uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar14 * 2);
      uVar22 = (uint)uVar4 -
               (uint)(uVar11 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)uVar4 * 4));
      iVar23 = -(uint)(uVar11 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                         (ulong)uVar4 * 4));
      pcVar9 = local_298._M_dataplus._M_p + local_298._M_string_length;
      _Var15._M_p = local_298._M_dataplus._M_p;
      uVar14 = uVar22;
      uVar8 = uVar22;
      if (local_298._M_string_length != 0) {
        _Var16._M_p = local_298._M_dataplus._M_p;
        sVar19 = local_298._M_string_length;
        uVar13 = uVar22;
        do {
          cVar2 = *_Var16._M_p;
          uVar20 = uVar8 - (int)cVar2;
          _Var15._M_p = _Var16._M_p;
          uVar14 = uVar13;
          if ((uVar20 == 0 || (int)uVar8 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar13 = uVar13 + 1;
          _Var16._M_p = _Var16._M_p + 1;
          sVar19 = sVar19 - 1;
          _Var15._M_p = pcVar9;
          uVar14 = (int)local_298._M_string_length + iVar23 + (uint)uVar4;
          uVar8 = uVar20;
        } while (sVar19 != 0);
      }
      if (_Var15._M_p == pcVar9) {
        uVar14 = uVar14 + (int)(uVar8 - 1) / (int)pcVar9[-1];
      }
      pcVar9 = local_278 + (int)uVar22;
      uVar8 = uVar11;
      if (99 < uVar11) {
        do {
          uVar8 = uVar11 / 100;
          *(undefined2 *)(pcVar9 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar11 % 100) * 2);
          pcVar9 = pcVar9 + -2;
          bVar6 = 9999 < uVar11;
          uVar11 = uVar11 / 100;
        } while (bVar6);
      }
      if (uVar8 < 10) {
        pcVar9[-1] = (byte)uVar8 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar9 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar8 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0025b290;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar14 = uVar14 + this->prefix_size;
      if (-1 < (int)uVar14) {
        size = (ulong)uVar14;
        if (500 < uVar14) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
        }
        pcVar9 = local_248.super_buffer<char>.ptr_;
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (size <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = size;
        }
        pcVar21 = local_248.super_buffer<char>.ptr_ + (size - 1);
        if (1 < (int)uVar22) {
          uVar17 = (ulong)uVar22;
          iVar18 = iVar23 + (uint)uVar4 + 1;
          iVar23 = 0;
          _Var15._M_p = local_298._M_dataplus._M_p;
          do {
            uVar17 = uVar17 - 1;
            pcVar1 = pcVar21 + -1;
            *pcVar21 = local_278[uVar17 & 0xffffffff];
            cVar2 = *_Var15._M_p;
            if (0 < cVar2) {
              iVar23 = iVar23 + 1;
              if ((cVar2 != '\x7f') && (iVar23 % (int)cVar2 == 0)) {
                if (_Var15._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
                  iVar23 = 0;
                  _Var15._M_p = _Var15._M_p + 1;
                }
                pcVar21[-1] = cVar7;
                pcVar1 = pcVar21 + -2;
              }
            }
            pcVar21 = pcVar1;
            iVar18 = iVar18 + -1;
          } while (2 < iVar18);
        }
        *pcVar21 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar21[-1] = '-';
        }
        pbVar5 = this->specs;
        uVar17 = (ulong)pbVar5->width;
        if (-1 < (long)uVar17) {
          uVar12 = 0;
          if (size <= uVar17) {
            uVar12 = uVar17 - size;
          }
          bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + size + (pbVar5->fill).size_ * uVar12) {
            (*(code *)**(undefined8 **)
                        bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar17 = uVar12 >> (bVar3 & 0x3f);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar17,&pbVar5->fill);
          bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (pcVar9,pcVar9 + size,bVar10);
          bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar10,uVar12 - uVar17,&pbVar5->fill);
          (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_);
          }
          goto LAB_0021344f;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_0021344f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }